

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O2

void google::protobuf::TestUtil::AddRepeatedFields1<proto2_unittest::TestAllTypes>
               (TestAllTypes *message)

{
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_RepeatedGroup>_>
  *pVVar1;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>_>
  *pVVar2;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::ForeignMessage>_> *pVVar3;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessage>_>
  *pVVar4;
  Reflection *pRVar5;
  Descriptor *pDVar6;
  FieldDescriptor *pFVar7;
  string_view name;
  string_view name_00;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  RepeatedField<int>::Add(&(message->field_0)._impl_.repeated_int32_,0xc9);
  RepeatedField<long>::Add(&(message->field_0)._impl_.repeated_int64_,0xca);
  RepeatedField<unsigned_int>::Add(&(message->field_0)._impl_.repeated_uint32_,0xcb);
  RepeatedField<unsigned_long>::Add(&(message->field_0)._impl_.repeated_uint64_,0xcc);
  RepeatedField<int>::Add(&(message->field_0)._impl_.repeated_sint32_,0xcd);
  RepeatedField<long>::Add(&(message->field_0)._impl_.repeated_sint64_,0xce);
  RepeatedField<unsigned_int>::Add(&(message->field_0)._impl_.repeated_fixed32_,0xcf);
  RepeatedField<unsigned_long>::Add(&(message->field_0)._impl_.repeated_fixed64_,0xd0);
  RepeatedField<int>::Add(&(message->field_0)._impl_.repeated_sfixed32_,0xd1);
  RepeatedField<long>::Add(&(message->field_0)._impl_.repeated_sfixed64_,0xd2);
  RepeatedField<float>::Add(&(message->field_0)._impl_.repeated_float_,211.0);
  RepeatedField<double>::Add(&(message->field_0)._impl_.repeated_double_,212.0);
  RepeatedField<bool>::Add(&(message->field_0)._impl_.repeated_bool_,true);
  internal::AddToRepeatedPtrField<char_const(&)[4]>
            (&(message->field_0)._impl_.repeated_string_,(char (*) [4])"215");
  internal::AddToRepeatedPtrField<char_const(&)[4],google::protobuf::internal::BytesTag>
            ((undefined1 *)((long)&message->field_0 + 0xf8),"216");
  pVVar1 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_RepeatedGroup>>
                     (&(message->field_0)._impl_.repeatedgroup_.super_RepeatedPtrFieldBase);
  (pVVar1->field_0)._impl_.a_ = 0xd9;
  *(byte *)&pVVar1->field_0 = *(byte *)&pVVar1->field_0 | 1;
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>>
                     (&(message->field_0)._impl_.repeated_nested_message_.super_RepeatedPtrFieldBase
                     );
  (pVVar2->field_0)._impl_.bb_ = 0xda;
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
  pVVar3 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::ForeignMessage>>
                     (&(message->field_0)._impl_.repeated_foreign_message_.
                       super_RepeatedPtrFieldBase);
  (pVVar3->field_0)._impl_.c_ = 0xdb;
  *(byte *)&pVVar3->field_0 = *(byte *)&pVVar3->field_0 | 1;
  pVVar4 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessage>>
                     (&(message->field_0)._impl_.repeated_import_message_.super_RepeatedPtrFieldBase
                     );
  (pVVar4->field_0)._impl_.d_ = 0xdc;
  *(byte *)&pVVar4->field_0 = *(byte *)&pVVar4->field_0 | 1;
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>>
                     (&(message->field_0)._impl_.repeated_lazy_message_.super_RepeatedPtrFieldBase);
  (pVVar2->field_0)._impl_.bb_ = 0xe3;
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
  proto2_unittest::TestAllTypes::add_repeated_nested_enum(message,TestAllTypes_NestedEnum_BAR);
  proto2_unittest::TestAllTypes::add_repeated_foreign_enum(message,FOREIGN_BAR);
  proto2_unittest::TestAllTypes::add_repeated_import_enum(message,IMPORT_BAR);
  pRVar5 = proto2_unittest::TestAllTypes::GetReflection();
  pDVar6 = proto2_unittest::TestAllTypes::GetDescriptor();
  name._M_str = "repeated_string_piece";
  name._M_len = 0x15;
  pFVar7 = Descriptor::FindFieldByName(pDVar6,name);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"224",&local_59);
  Reflection::AddString(pRVar5,&message->super_Message,pFVar7,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  pRVar5 = proto2_unittest::TestAllTypes::GetReflection();
  pDVar6 = proto2_unittest::TestAllTypes::GetDescriptor();
  name_00._M_str = "repeated_cord";
  name_00._M_len = 0xd;
  pFVar7 = Descriptor::FindFieldByName(pDVar6,name_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"225",&local_59);
  Reflection::AddString(pRVar5,&message->super_Message,pFVar7,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void AddRepeatedFields1(TestAllTypes* message) {
  message->add_repeated_int32(201);
  message->add_repeated_int64(202);
  message->add_repeated_uint32(203);
  message->add_repeated_uint64(204);
  message->add_repeated_sint32(205);
  message->add_repeated_sint64(206);
  message->add_repeated_fixed32(207);
  message->add_repeated_fixed64(208);
  message->add_repeated_sfixed32(209);
  message->add_repeated_sfixed64(210);
  message->add_repeated_float(211);
  message->add_repeated_double(212);
  message->add_repeated_bool(true);
  message->add_repeated_string("215");
  message->add_repeated_bytes("216");

  message->add_repeatedgroup()->set_a(217);
  message->add_repeated_nested_message()->set_bb(218);
  message->add_repeated_foreign_message()->set_c(219);
  message->add_repeated_import_message()->set_d(220);
  message->add_repeated_lazy_message()->set_bb(227);

  message->add_repeated_nested_enum(TestAllTypes::BAR);
  message->add_repeated_foreign_enum(ForeignEnum<TestAllTypes>::FOREIGN_BAR);
  message->add_repeated_import_enum(ImportEnum<TestAllTypes>::IMPORT_BAR);

#ifndef PROTOBUF_TEST_NO_DESCRIPTORS
  message->GetReflection()->AddString(
      message,
      message->GetDescriptor()->FindFieldByName("repeated_string_piece"),
      "224");
  message->GetReflection()->AddString(
      message, message->GetDescriptor()->FindFieldByName("repeated_cord"),
      "225");
#endif  // !PROTOBUF_TEST_NO_DESCRIPTORS
}